

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O3

int Intp_ManProofRecordOne(Intp_Man_t *p,Sto_Cls_t *pClause)

{
  size_t __size;
  Sto_Cls_t **ppSVar1;
  long lVar2;
  Sto_Cls_t *pSVar3;
  void *pvVar4;
  void **ppvVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  Sto_Cls_t *pFinal;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  Vec_Ptr_t *pVVar15;
  
  uVar7 = *(uint *)&pClause->field_0x1c;
  if ((uVar7 & 0x7fffff8) == 0) {
    __assert_fail("pClause->nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x2a2,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
  }
  if ((uVar7 & 2) != 0) {
    __assert_fail("!pClause->fRoot",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x2a6,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
  }
  if (p->nTrailSize != p->nRootSize) {
    __assert_fail("p->nTrailSize == p->nRootSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x2a7,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
  }
  uVar6 = uVar7 >> 3 & 0xffffff;
  if (uVar6 != 0) {
    uVar13 = 0;
    do {
      iVar11 = *(int *)((long)&pClause[1].pNext + uVar13 * 4);
      if (p->pAssigns[iVar11 >> 1] == iVar11) goto LAB_008e2413;
      uVar13 = uVar13 + 1;
    } while (uVar6 != uVar13);
  }
  uVar13 = 0;
  do {
    uVar6 = *(uint *)((long)&pClause[1].pNext + uVar13 * 4);
    uVar10 = uVar6 ^ 1;
    iVar11 = (int)uVar6 >> 1;
    uVar6 = p->pAssigns[iVar11];
    if (uVar6 == 0xffffffff) {
      p->pAssigns[iVar11] = uVar10;
      p->pReasons[iVar11] = (Sto_Cls_t *)0x0;
      iVar11 = p->nTrailSize;
      p->nTrailSize = iVar11 + 1;
      p->pTrail[iVar11] = uVar10;
      uVar7 = *(uint *)&pClause->field_0x1c;
    }
    else if (uVar6 != uVar10) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                    ,0x2b7,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 < (uVar7 >> 3 & 0xffffff));
  pSVar3 = Intp_ManPropagate(p,p->nRootSize);
  if (pSVar3 == (Sto_Cls_t *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x2bf,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
  }
  uVar6 = *(uint *)&pClause->field_0x1c >> 3 & 0xffffff;
  uVar7 = *(uint *)&pSVar3->field_0x1c >> 3 & 0xffffff;
  if (uVar6 < uVar7) {
LAB_008e245b:
    Intp_ManProofTraceOne(p,pSVar3,pClause);
    iVar11 = p->nRootSize;
    lVar9 = (long)p->nTrailSize;
    if (iVar11 < p->nTrailSize) {
      do {
        lVar2 = lVar9 + -1;
        lVar9 = lVar9 + -1;
        iVar12 = p->pTrail[lVar2] >> 1;
        p->pReasons[iVar12] = (Sto_Cls_t *)0x0;
        p->pAssigns[iVar12] = -1;
      } while (iVar11 < lVar9);
    }
    p->nTrailSize = iVar11;
    uVar7 = *(uint *)&pClause->field_0x1c >> 3 & 0xffffff;
    if (1 < uVar7) {
      uVar7 = *(uint *)&pClause[1].pNext;
      if ((-1 < (int)uVar7) && ((int)(uVar7 >> 1) < p->pCnf->nVars)) {
        ppSVar1 = p->pWatches;
        pClause->pNext0 = ppSVar1[(ulong)uVar7 ^ 1];
        ppSVar1[(ulong)uVar7 ^ 1] = pClause;
        uVar6 = *(uint *)((long)&pClause[1].pNext + 4);
        if ((-1 < (int)uVar6) && ((int)(uVar6 >> 1) < p->pCnf->nVars)) {
          ppSVar1 = p->pWatches;
          (&pClause->pNext0)[uVar7 != uVar6] = ppSVar1[(ulong)uVar6 ^ 1];
          ppSVar1[(ulong)uVar6 ^ 1] = pClause;
          return 1;
        }
      }
      __assert_fail("lit_check(Lit, p->pCnf->nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                    ,0x115,"void Intp_ManWatchClause(Intp_Man_t *, Sto_Cls_t *, lit)");
    }
    if (uVar7 != 1) {
      __assert_fail("pClause->nLits == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                    ,0x2e7,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
    }
    iVar11 = *(int *)&pClause[1].pNext;
    iVar8 = iVar11 >> 1;
    iVar12 = p->pAssigns[iVar8];
    if (iVar12 == -1) {
      p->pAssigns[iVar8] = iVar11;
      p->pReasons[iVar8] = pClause;
      iVar12 = p->nTrailSize;
      p->nTrailSize = iVar12 + 1;
      p->pTrail[iVar12] = iVar11;
    }
    else if (iVar12 != iVar11) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                    ,0x2ec,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
    }
    pSVar3 = Intp_ManPropagate(p,p->nRootSize);
    if (pSVar3 != (Sto_Cls_t *)0x0) {
      pVVar15 = p->vAntClas;
      iVar11 = pVVar15->nSize;
      pFinal = p->pCnf->pEmpty;
      if (iVar11 < pFinal->Id - p->nAntStart) {
        do {
          pvVar4 = calloc(1,0x10);
          if (iVar11 == pVVar15->nCap) {
            if (iVar11 < 0x10) {
              if (pVVar15->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc(0x80);
              }
              else {
                ppvVar5 = (void **)realloc(pVVar15->pArray,0x80);
              }
              pVVar15->pArray = ppvVar5;
              pVVar15->nCap = 0x10;
            }
            else {
              __size = (ulong)(uint)(iVar11 * 2) * 8;
              if (pVVar15->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc(__size);
              }
              else {
                ppvVar5 = (void **)realloc(pVVar15->pArray,__size);
              }
              pVVar15->pArray = ppvVar5;
              pVVar15->nCap = iVar11 * 2;
            }
          }
          else {
            ppvVar5 = pVVar15->pArray;
          }
          iVar11 = pVVar15->nSize;
          pVVar15->nSize = iVar11 + 1;
          ppvVar5[iVar11] = pvVar4;
          pVVar15 = p->vAntClas;
          iVar11 = pVVar15->nSize;
          pFinal = p->pCnf->pEmpty;
        } while (iVar11 < pFinal->Id - p->nAntStart);
      }
      Intp_ManProofTraceOne(p,pSVar3,pFinal);
      return 0;
    }
    p->nRootSize = p->nTrailSize;
  }
  else {
    uVar13 = 0;
    if (uVar7 == 0) {
LAB_008e23ce:
      if ((uint)uVar13 != uVar7) goto LAB_008e245b;
    }
    else {
      do {
        uVar14 = 0;
        while (*(int *)((long)&pSVar3[1].pNext + uVar13 * 4) !=
               *(int *)((long)&pClause[1].pNext + uVar14 * 4)) {
          uVar14 = uVar14 + 1;
          if (uVar6 == uVar14) goto LAB_008e23ce;
        }
        if (uVar6 == (uint)uVar14) goto LAB_008e23ce;
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar7);
    }
    iVar11 = p->nRootSize;
    lVar9 = (long)p->nTrailSize;
    if (iVar11 < p->nTrailSize) {
      do {
        lVar2 = lVar9 + -1;
        lVar9 = lVar9 + -1;
        iVar12 = p->pTrail[lVar2] >> 1;
        p->pReasons[iVar12] = (Sto_Cls_t *)0x0;
        p->pAssigns[iVar12] = -1;
      } while (iVar11 < lVar9);
    }
    p->nTrailSize = iVar11;
LAB_008e2413:
    pVVar15 = p->vAntClas;
    pvVar4 = calloc(1,0x10);
    uVar7 = pVVar15->nSize;
    if (uVar7 == pVVar15->nCap) {
      if ((int)uVar7 < 0x10) {
        if (pVVar15->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(0x80);
        }
        else {
          ppvVar5 = (void **)realloc(pVVar15->pArray,0x80);
        }
        pVVar15->pArray = ppvVar5;
        pVVar15->nCap = 0x10;
      }
      else {
        if (pVVar15->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc((ulong)uVar7 << 4);
        }
        else {
          ppvVar5 = (void **)realloc(pVVar15->pArray,(ulong)uVar7 << 4);
        }
        pVVar15->pArray = ppvVar5;
        pVVar15->nCap = uVar7 * 2;
      }
    }
    else {
      ppvVar5 = pVVar15->pArray;
    }
    iVar11 = pVVar15->nSize;
    pVVar15->nSize = iVar11 + 1;
    ppvVar5[iVar11] = pvVar4;
  }
  return 1;
}

Assistant:

int Intp_ManProofRecordOne( Intp_Man_t * p, Sto_Cls_t * pClause )
{
    Sto_Cls_t * pConflict;
    int i;

    // empty clause never ends up there
    assert( pClause->nLits > 0 );
    if ( pClause->nLits == 0 )
        printf( "Error: Empty clause is attempted.\n" );

    assert( !pClause->fRoot );
    assert( p->nTrailSize == p->nRootSize );

    // if any of the clause literals are already assumed
    // it means that the clause is redundant and can be skipped
    for ( i = 0; i < (int)pClause->nLits; i++ )
        if ( p->pAssigns[lit_var(pClause->pLits[i])] == pClause->pLits[i] )
        {
//            Vec_IntPush( p->vBreaks, Vec_IntSize(p->vAnties) );
            Vec_PtrPush( p->vAntClas, Vec_IntAlloc(0) );
            return 1;
        }

    // add assumptions to the trail
    for ( i = 0; i < (int)pClause->nLits; i++ )
        if ( !Intp_ManEnqueue( p, lit_neg(pClause->pLits[i]), NULL ) )
        {
            assert( 0 ); // impossible
            return 0;
        }

    // propagate the assumptions
    pConflict = Intp_ManPropagate( p, p->nRootSize );
    if ( pConflict == NULL )
    {
        assert( 0 ); // cannot prove
        return 0;
    }

    // skip the clause if it is weaker or the same as the conflict clause
    if ( pClause->nLits >= pConflict->nLits )
    {
        // check if every literal of conflict clause can be found in the given clause
        int j;
        for ( i = 0; i < (int)pConflict->nLits; i++ )
        {
            for ( j = 0; j < (int)pClause->nLits; j++ )
                if ( pConflict->pLits[i] == pClause->pLits[j] )
                    break;
            if ( j == (int)pClause->nLits ) // literal pConflict->pLits[i] is not found
                break;
        }
        if ( i == (int)pConflict->nLits ) // all lits are found
        {
            // undo to the root level
            Intp_ManCancelUntil( p, p->nRootSize );
//            Vec_IntPush( p->vBreaks, Vec_IntSize(p->vAnties) );
            Vec_PtrPush( p->vAntClas, Vec_IntAlloc(0) );
            return 1;
        }
    }

    // construct the proof
    Intp_ManProofTraceOne( p, pConflict, pClause );

    // undo to the root level
    Intp_ManCancelUntil( p, p->nRootSize );

    // add large clauses to the watched lists
    if ( pClause->nLits > 1 )
    {
        Intp_ManWatchClause( p, pClause, pClause->pLits[0] );
        Intp_ManWatchClause( p, pClause, pClause->pLits[1] );
        return 1;
    }
    assert( pClause->nLits == 1 );

    // if the clause proved is unit, add it and propagate
    if ( !Intp_ManEnqueue( p, pClause->pLits[0], pClause ) )
    {
        assert( 0 ); // impossible
        return 0;
    }

    // propagate the assumption
    pConflict = Intp_ManPropagate( p, p->nRootSize );
    if ( pConflict )
    {
        // insert place-holders till the empty clause
        while ( Vec_PtrSize(p->vAntClas) < p->pCnf->pEmpty->Id - p->nAntStart )
            Vec_PtrPush( p->vAntClas, Vec_IntAlloc(0) );
        // construct the proof for the empty clause
        Intp_ManProofTraceOne( p, pConflict, p->pCnf->pEmpty );
//        if ( p->fVerbose )
//            printf( "Found last conflict after adding unit clause number %d!\n", pClause->Id );
        return 0;
    }

    // update the root level
    p->nRootSize = p->nTrailSize;
    return 1;
}